

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  __m128i *palVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong size;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i alVar38;
  undefined4 uVar40;
  undefined1 auVar39 [16];
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined4 uVar47;
  __m128i_64_t A;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int64_t iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i_64_t B;
  undefined1 auVar64 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar14 = profile->s1Len;
        if ((int)uVar14 < 1) {
          parasail_nw_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar26 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            uVar9 = uVar14 - 1;
            size = (ulong)uVar14 + 1 >> 1;
            iVar10 = (int)(uVar9 / size);
            uVar19 = (ulong)(uint)open;
            iVar12 = -open;
            iVar15 = ppVar3->min;
            uVar27 = 0x8000000000000000 - (long)iVar15;
            if (iVar15 != iVar12 && SBORROW4(iVar15,iVar12) == iVar15 + open < 0) {
              uVar27 = uVar19 | 0x8000000000000000;
            }
            iVar15 = ppVar3->max;
            ppVar11 = parasail_result_new_table1((uint)((ulong)uVar14 + 1) & 0x7ffffffe,s2Len);
            if (ppVar11 != (parasail_result_t *)0x0) {
              ppVar11->flag = ppVar11->flag | 0x2820401;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar13 = s2Len + -1;
                uVar41 = (ulong)(uint)open;
                lVar16 = uVar27 + 1;
                lVar18 = 0x7ffffffffffffffe - (long)iVar15;
                uVar46 = (undefined4)lVar16;
                uVar47 = (undefined4)((ulong)lVar16 >> 0x20);
                uVar40 = (undefined4)((ulong)lVar18 >> 0x20);
                auVar44._8_4_ = (int)lVar18;
                auVar44._0_8_ = lVar18;
                auVar44._12_4_ = uVar40;
                uVar22 = (ulong)(uint)gap;
                lVar23 = (long)iVar12;
                lVar17 = size << 4;
                lVar24 = 0;
                lVar25 = lVar23;
                do {
                  auVar48._8_8_ = -(size * uVar22) + lVar25;
                  auVar48._0_8_ = lVar25;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar24) = auVar48;
                  plVar1 = (long *)((long)*ptr + lVar24);
                  *plVar1 = lVar25 - uVar19;
                  plVar1[1] = (-(size * uVar22) - uVar19) + lVar25;
                  lVar25 = lVar25 - uVar22;
                  lVar24 = lVar24 + 0x10;
                } while (lVar17 != lVar24);
                *ptr_00 = 0;
                auVar49 = _DAT_00906ca0;
                lVar25 = uVar26 - 1;
                auVar29._8_4_ = (int)lVar25;
                auVar29._0_8_ = lVar25;
                auVar29._12_4_ = (int)((ulong)lVar25 >> 0x20);
                uVar19 = 0;
                auVar48 = pmovsxbq(auVar48,0x100);
                auVar29 = auVar29 ^ _DAT_00906ca0;
                do {
                  if ((bool)(~(auVar29._0_8_ < (long)(uVar19 ^ auVar49._0_8_)) & 1)) {
                    ptr_00[uVar19 + 1] = lVar23;
                  }
                  auVar58._8_4_ = (int)uVar19;
                  auVar58._0_8_ = uVar19;
                  auVar58._12_4_ = (int)(uVar19 >> 0x20);
                  if ((long)((auVar58._8_8_ | auVar48._8_8_) ^ auVar49._8_8_) <= auVar29._8_8_) {
                    ptr_00[uVar19 + 2] = lVar23 - uVar22;
                  }
                  uVar19 = uVar19 + 2;
                  lVar23 = lVar23 + uVar22 * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar19);
                lVar25 = -uVar41;
                uVar22 = (ulong)(uint)open;
                lVar23 = -uVar22;
                uVar14 = (int)size - 1;
                palVar20 = ptr_03 + uVar14;
                uVar19 = size;
                do {
                  (*palVar20)[0] = lVar25;
                  (*palVar20)[1] = lVar23;
                  lVar25 = lVar25 - (ulong)(uint)gap;
                  lVar23 = lVar23 - (ulong)(uint)gap;
                  palVar20 = palVar20 + -1;
                  iVar15 = (int)uVar19;
                  uVar21 = iVar15 - 1;
                  uVar19 = (ulong)uVar21;
                } while (uVar21 != 0 && 0 < iVar15);
                palVar20 = ptr_02 + uVar14;
                lVar25 = 0;
                uVar19 = 0;
                auVar49._8_4_ = uVar46;
                auVar49._0_8_ = lVar16;
                auVar49._12_4_ = uVar47;
                do {
                  auVar52._8_4_ = (int)(*palVar20)[0];
                  auVar52._0_8_ = (*palVar20)[0];
                  auVar52._12_4_ = *(undefined4 *)((long)*palVar20 + 4);
                  iVar15 = ppVar3->mapper[(byte)s2[uVar19]];
                  auVar5._8_4_ = uVar46;
                  auVar5._0_8_ = lVar16;
                  auVar5._12_4_ = uVar47;
                  auVar56._0_8_ = lVar16 - (*ptr_03)[0];
                  auVar56._8_8_ = auVar5._8_8_ - (*ptr_03)[1];
                  lVar24 = 0;
                  auVar59._8_4_ = uVar46;
                  auVar59._0_8_ = lVar16;
                  auVar59._12_4_ = uVar47;
                  iVar51 = ptr_00[uVar19];
                  lVar23 = auVar52._8_8_;
                  do {
                    plVar1 = (long *)((long)*ptr_02 + lVar24);
                    lVar7 = *plVar1;
                    lVar8 = plVar1[1];
                    plVar1 = (long *)((long)*ptr + lVar24);
                    auVar63._0_8_ = *plVar1 - (ulong)(uint)gap;
                    auVar63._8_8_ = plVar1[1] - (ulong)(uint)gap;
                    plVar1 = (long *)((long)pvVar2 + lVar24 + (long)iVar15 * (long)(int)size * 0x10)
                    ;
                    auVar53._0_8_ = iVar51 + *plVar1;
                    auVar53._8_8_ = lVar23 + plVar1[1];
                    plVar1 = (long *)((long)*ptr_03 + lVar24);
                    auVar55._0_8_ = auVar56._0_8_ + *plVar1;
                    auVar55._8_8_ = auVar56._8_8_ + plVar1[1];
                    auVar64._0_8_ = lVar7 - uVar41;
                    auVar64._8_8_ = lVar8 - uVar22;
                    auVar30._0_8_ = -(ulong)(auVar55._0_8_ < auVar59._0_8_);
                    auVar30._8_8_ = -(ulong)(auVar55._8_8_ < auVar59._8_8_);
                    auVar59 = blendvpd(auVar55,auVar59,auVar30);
                    auVar31._0_8_ = -(ulong)(auVar64._0_8_ < auVar63._0_8_);
                    auVar31._8_8_ = -(ulong)(auVar64._8_8_ < auVar63._8_8_);
                    auVar48 = blendvpd(auVar64,auVar63,auVar31);
                    auVar32._0_8_ = -(ulong)(auVar53._0_8_ < auVar48._0_8_);
                    auVar32._8_8_ = -(ulong)(auVar53._8_8_ < auVar48._8_8_);
                    auVar56 = blendvpd(auVar53,auVar48,auVar32);
                    *(undefined1 (*) [16])((long)*ptr + lVar24) = auVar48;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar24) = auVar56;
                    lVar24 = lVar24 + 0x10;
                    iVar51 = lVar7;
                    lVar23 = lVar8;
                  } while (lVar17 != lVar24);
                  auVar61._0_8_ = auVar56._0_8_;
                  auVar61._8_4_ = auVar56._0_4_;
                  auVar61._12_4_ = auVar56._4_4_;
                  lVar23 = ptr_00[uVar19 + 1];
                  uVar19 = uVar19 + 1;
                  auVar62._8_8_ = auVar61._8_8_;
                  auVar62._0_8_ = lVar23;
                  lVar24 = lVar23 + (*ptr_03)[0];
                  if (lVar24 < auVar59._0_8_) {
                    lVar24 = auVar59._0_8_;
                  }
                  auVar60._8_8_ = lVar24;
                  auVar60._0_8_ = lVar16;
                  auVar33._0_8_ = -(ulong)(lVar16 < lVar23);
                  auVar33._8_8_ = -(ulong)(lVar24 < auVar62._8_8_);
                  auVar48 = blendvpd(auVar60,auVar62,auVar33);
                  lVar24 = 0;
                  lVar23 = lVar25;
                  do {
                    auVar57._0_8_ = auVar60._0_8_ - (ulong)(uint)gap;
                    auVar57._8_8_ = auVar60._8_8_ - (ulong)(uint)gap;
                    auVar54._0_8_ = auVar48._0_8_ - uVar41;
                    auVar54._8_8_ = auVar48._8_8_ - uVar22;
                    auVar34._0_8_ = -(ulong)(auVar54._0_8_ < auVar57._0_8_);
                    auVar34._8_8_ = -(ulong)(auVar54._8_8_ < auVar57._8_8_);
                    auVar60 = blendvpd(auVar54,auVar57,auVar34);
                    auVar48 = *(undefined1 (*) [16])((long)*ptr_01 + lVar24);
                    auVar35._0_8_ = -(ulong)(auVar60._0_8_ < auVar48._0_8_);
                    auVar35._8_8_ = -(ulong)(auVar60._8_8_ < auVar48._8_8_);
                    auVar48 = blendvpd(auVar60,auVar48,auVar35);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar24) = auVar48;
                    auVar36._0_8_ = -(ulong)(auVar44._0_8_ < auVar48._0_8_);
                    auVar36._8_8_ = -(ulong)(auVar44._8_8_ < auVar48._8_8_);
                    auVar44 = blendvpd(auVar48,auVar44,auVar36);
                    auVar37._0_8_ = -(ulong)(auVar48._0_8_ < auVar49._0_8_);
                    auVar37._8_8_ = -(ulong)(auVar48._8_8_ < auVar49._8_8_);
                    auVar49 = blendvpd(auVar48,auVar49,auVar37);
                    piVar4 = ((ppVar11->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar23) = auVar48._0_4_;
                    *(int *)((long)piVar4 + size * uVar26 * 4 + lVar23) = auVar48._8_4_;
                    lVar24 = lVar24 + 0x10;
                    lVar23 = lVar23 + uVar26 * 4;
                  } while (lVar17 != lVar24);
                  lVar25 = lVar25 + 4;
                } while (uVar19 != uVar26);
                alVar38 = ptr_02[(ulong)uVar9 % size];
                auVar28 = alVar38._0_12_;
                if (iVar10 < 1) {
                  do {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = alVar38[0];
                    alVar38 = (__m128i)(auVar6 << 0x40);
                    auVar28 = alVar38._0_12_;
                  } while (iVar10 < 0);
                }
                auVar42._8_4_ = (int)uVar27;
                auVar42._0_8_ = uVar27;
                auVar42._12_4_ = (int)(uVar27 >> 0x20);
                auVar45._0_8_ = -(ulong)((long)uVar27 < auVar44._0_8_);
                auVar45._8_8_ = -(ulong)(auVar42._8_8_ < auVar44._8_8_);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar39._8_4_ = (int)lVar18;
                auVar39._0_8_ = lVar18;
                auVar39._12_4_ = uVar40;
                auVar50._0_8_ = -(ulong)(lVar18 < auVar49._0_8_);
                auVar50._8_8_ = -(ulong)(auVar39._8_8_ < auVar49._8_8_);
                iVar15 = movmskpd(iVar10,auVar50 | auVar43 ^ auVar45);
                if (iVar15 == 0) {
                  iVar15 = auVar28._8_4_;
                }
                else {
                  *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                  iVar15 = 0;
                  iVar13 = 0;
                  uVar9 = 0;
                }
                ppVar11->score = iVar15;
                ppVar11->end_query = uVar9;
                ppVar11->end_ref = iVar13;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar11;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}